

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsPublicationPublishNamedPoint(HelicsPublication pub,char *str,double val,HelicsError *err)

{
  Publication *this;
  undefined1 auVar1 [16];
  PublicationObject *pPVar2;
  size_t sVar3;
  string_view field;
  undefined1 local_30 [16];
  
  pPVar2 = anon_unknown.dwarf_7c49a::verifyPublication(pub,err);
  if (pPVar2 != (PublicationObject *)0x0) {
    this = pPVar2->pubPtr;
    if (str == (char *)0x0) {
      local_30[0] = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_30;
      helics::Publication::publish(this,(string_view)(auVar1 << 0x40),val);
    }
    else {
      sVar3 = strlen(str);
      field._M_str = str;
      field._M_len = sVar3;
      helics::Publication::publish(this,field,val);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishNamedPoint(HelicsPublication pub, const char* str, double val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        if (str == nullptr) {
            pubObj->pubPtr->publish(std::string(), val);
        } else {
            pubObj->pubPtr->publish(str, val);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}